

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

bool __thiscall dg::vr::RelationsAnalyzer::isSafe(RelationsAnalyzer *this,I inst)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  const_iterator cVar4;
  undefined1 auVar5 [16];
  key_type local_38;
  
  cVar1 = llvm::Instruction::mayWriteToMemory();
  if ((cVar1 == '\0') && (cVar1 = llvm::Instruction::mayHaveSideEffects(), cVar1 == '\0')) {
    return true;
  }
  if (inst[0x10] == (Instruction)0x53) {
    lVar3 = *(long *)(inst + -0x20);
    if ((((lVar3 != 0) && (*(char *)(lVar3 + 0x10) == '\0')) &&
        (*(long *)(lVar3 + 0x18) == *(long *)(inst + 0x48))) &&
       (((*(byte *)(lVar3 + 0x21) & 0x20) != 0 &&
        (bVar2 = isIgnorableIntrinsic(*(ID *)(lVar3 + 0x24)), bVar2)))) {
      return true;
    }
    lVar3 = *(long *)(inst + -0x20);
    if (((lVar3 != 0) && (*(char *)(lVar3 + 0x10) == '\0')) &&
       (*(long *)(lVar3 + 0x18) == *(long *)(inst + 0x48))) {
      auVar5 = llvm::Value::getName();
      lVar3 = auVar5._0_8_;
      if (lVar3 == 0) {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        local_38._M_string_length = 0;
        local_38.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,lVar3,auVar5._8_8_ + lVar3);
      }
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,
                        CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                                 local_38.field_2._M_local_buf[0]) + 1);
      }
      if (cVar4._M_node != (_Base_ptr)(this + 8)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool RelationsAnalyzer::isSafe(I inst) const {
    if (!inst->mayWriteToMemory() && !inst->mayHaveSideEffects())
        return true;

    if (const auto *intrinsic = llvm::dyn_cast<llvm::IntrinsicInst>(inst)) {
        if (isIgnorableIntrinsic(intrinsic->getIntrinsicID())) {
            return true;
        }
    }

    if (const auto *call = llvm::dyn_cast<llvm::CallInst>(inst)) {
        const auto *function = call->getCalledFunction();
        if (function && safeFunctions.find(function->getName().str()) !=
                                safeFunctions.end())
            return true;
    }
    return false;
}